

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

XML_Error processInternalEntity(XML_Parser parser,ENTITY *entity,XML_Bool betweenDecl)

{
  int tok_00;
  OPEN_INTERNAL_ENTITY *pOStack_50;
  int tok;
  OPEN_INTERNAL_ENTITY *openEntity;
  char *pcStack_40;
  XML_Error result;
  char *next;
  char *textEnd;
  char *textStart;
  ENTITY *pEStack_20;
  XML_Bool betweenDecl_local;
  ENTITY *entity_local;
  XML_Parser parser_local;
  
  textStart._7_1_ = betweenDecl;
  pEStack_20 = entity;
  entity_local = (ENTITY *)parser;
  if (parser->m_freeInternalEntities == (OPEN_INTERNAL_ENTITY *)0x0) {
    pOStack_50 = (OPEN_INTERNAL_ENTITY *)(*(parser->m_mem).malloc_fcn)(0x28);
    if (pOStack_50 == (OPEN_INTERNAL_ENTITY *)0x0) {
      return XML_ERROR_NO_MEMORY;
    }
  }
  else {
    pOStack_50 = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = pOStack_50->next;
  }
  pEStack_20->open = '\x01';
  entityTrackingOnOpen((XML_Parser)entity_local,pEStack_20,0x16d9);
  pEStack_20->processed = 0;
  pOStack_50->next = (open_internal_entity *)entity_local[9].textPtr;
  entity_local[9].textPtr = (XML_Char *)pOStack_50;
  pOStack_50->entity = pEStack_20;
  pOStack_50->startTagLevel = *(int *)((long)&entity_local[9].systemId + 4);
  pOStack_50->betweenDecl = textStart._7_1_;
  pOStack_50->internalEventPtr = (char *)0x0;
  pOStack_50->internalEventEndPtr = (char *)0x0;
  pcStack_40 = pEStack_20->textPtr;
  next = pEStack_20->textPtr + pEStack_20->textLen;
  textEnd = pcStack_40;
  if (pEStack_20->is_param == '\0') {
    openEntity._4_4_ =
         doContent((XML_Parser)entity_local,*(int *)((long)&entity_local[9].systemId + 4),
                   (ENCODING *)entity_local[7].textPtr,pcStack_40,next,&stack0xffffffffffffffc0,'\0'
                   ,XML_ACCOUNT_ENTITY_EXPANSION);
  }
  else {
    tok_00 = (**(code **)entity_local[7].textPtr)
                       (entity_local[7].textPtr,pcStack_40,next,&stack0xffffffffffffffc0);
    openEntity._4_4_ =
         doProlog((XML_Parser)entity_local,(ENCODING *)entity_local[7].textPtr,textEnd,next,tok_00,
                  pcStack_40,&stack0xffffffffffffffc0,'\0','\0',XML_ACCOUNT_ENTITY_EXPANSION);
  }
  if (openEntity._4_4_ == XML_ERROR_NONE) {
    if ((next == pcStack_40) || (*(int *)&entity_local[0xe].systemId != 3)) {
      if (*(ENTITY **)(entity_local[9].textPtr + 0x18) == pEStack_20) {
        entityTrackingOnClose((XML_Parser)entity_local,pEStack_20,0x16fa);
        pEStack_20->open = '\0';
        entity_local[9].textPtr = (XML_Char *)pOStack_50->next;
        pOStack_50->next = *(open_internal_entity **)&entity_local[9].textLen;
        *(OPEN_INTERNAL_ENTITY **)&entity_local[9].textLen = pOStack_50;
      }
    }
    else {
      pEStack_20->processed = (int)pcStack_40 - (int)textEnd;
      entity_local[8].base = (XML_Char *)internalEntityProcessor;
    }
  }
  return openEntity._4_4_;
}

Assistant:

static enum XML_Error
processInternalEntity(XML_Parser parser, ENTITY *entity, XML_Bool betweenDecl) {
  const char *textStart, *textEnd;
  const char *next;
  enum XML_Error result;
  OPEN_INTERNAL_ENTITY *openEntity;

  if (parser->m_freeInternalEntities) {
    openEntity = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity->next;
  } else {
    openEntity
        = (OPEN_INTERNAL_ENTITY *)MALLOC(parser, sizeof(OPEN_INTERNAL_ENTITY));
    if (! openEntity)
      return XML_ERROR_NO_MEMORY;
  }
  entity->open = XML_TRUE;
#if XML_GE == 1
  entityTrackingOnOpen(parser, entity, __LINE__);
#endif
  entity->processed = 0;
  openEntity->next = parser->m_openInternalEntities;
  parser->m_openInternalEntities = openEntity;
  openEntity->entity = entity;
  openEntity->startTagLevel = parser->m_tagLevel;
  openEntity->betweenDecl = betweenDecl;
  openEntity->internalEventPtr = NULL;
  openEntity->internalEventEndPtr = NULL;
  textStart = (const char *)entity->textPtr;
  textEnd = (const char *)(entity->textPtr + entity->textLen);
  /* Set a safe default value in case 'next' does not get set */
  next = textStart;

  if (entity->is_param) {
    int tok
        = XmlPrologTok(parser->m_internalEncoding, textStart, textEnd, &next);
    result = doProlog(parser, parser->m_internalEncoding, textStart, textEnd,
                      tok, next, &next, XML_FALSE, XML_FALSE,
                      XML_ACCOUNT_ENTITY_EXPANSION);
  } else {
    result = doContent(parser, parser->m_tagLevel, parser->m_internalEncoding,
                       textStart, textEnd, &next, XML_FALSE,
                       XML_ACCOUNT_ENTITY_EXPANSION);
  }

  if (result == XML_ERROR_NONE) {
    if (textEnd != next && parser->m_parsingStatus.parsing == XML_SUSPENDED) {
      entity->processed = (int)(next - textStart);
      parser->m_processor = internalEntityProcessor;
    } else if (parser->m_openInternalEntities->entity == entity) {
#if XML_GE == 1
      entityTrackingOnClose(parser, entity, __LINE__);
#endif /* XML_GE == 1 */
      entity->open = XML_FALSE;
      parser->m_openInternalEntities = openEntity->next;
      /* put openEntity back in list of free instances */
      openEntity->next = parser->m_freeInternalEntities;
      parser->m_freeInternalEntities = openEntity;
    }
  }
  return result;
}